

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

void ssh2_ppk_derive_keys
               (uint fmt_version,ppk_cipher *ciphertype,ptrlen passphrase,strbuf *storage,
               ptrlen *cipherkey,ptrlen *cipheriv,ptrlen *mackey,ptrlen passphrase_salt,
               ppk_save_parameters *params)

{
  BinarySink *bs;
  ssh_hash *psVar1;
  uchar *puVar2;
  ssh_hashalg *psVar3;
  ptrlen pVar4;
  void *local_f8;
  size_t local_f0;
  void *local_e8;
  size_t local_e0;
  void *local_d8;
  size_t local_d0;
  undefined1 local_b8 [8];
  BinarySource src [1];
  ssh_hash *h;
  ssh_hash *h_1;
  anon_union_4_2_2262d70e_for_ppk_save_parameters_4 local_68;
  uint ctr;
  uint32_t passes;
  uint32_t taglen;
  ptrlen empty;
  size_t mac_keylen;
  ptrlen *cipherkey_local;
  strbuf *storage_local;
  ppk_cipher *ciphertype_local;
  uint fmt_version_local;
  ptrlen passphrase_local;
  
  if (fmt_version - 1 < 2) {
    for (h_1._4_4_ = 0; (ulong)(h_1._4_4_ * 0x14) < ciphertype->keylen; h_1._4_4_ = h_1._4_4_ + 1) {
      psVar1 = ssh_hash_new(&ssh_sha1);
      BinarySink_put_uint32(psVar1->binarysink_,(ulong)h_1._4_4_);
      BinarySink_put_datapl(psVar1->binarysink_,passphrase);
      puVar2 = (uchar *)strbuf_append(storage,0x14);
      ssh_hash_final(psVar1,puVar2);
    }
    strbuf_shrink_to(storage,ciphertype->keylen);
    BinarySink_put_padding(storage->binarysink_,ciphertype->ivlen,'\0');
    psVar1 = ssh_hash_new(&ssh_sha1);
    psVar3 = ssh_hash_alg(psVar1);
    empty.len = psVar3->hlen;
    bs = psVar1->binarysink_;
    join_0x00000010_0x00000000_ = make_ptrlen("putty-private-key-file-mac-key",0x1e);
    BinarySink_put_datapl(bs,join_0x00000010_0x00000000_);
    BinarySink_put_datapl(psVar1->binarysink_,passphrase);
    puVar2 = (uchar *)strbuf_append(storage,empty.len);
    ssh_hash_final(psVar1,puVar2);
  }
  else {
    if (fmt_version != 3) {
      __assert_fail("false && \"bad format version in ssh2_ppk_derive_keys\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                    0x2a7,
                    "void ssh2_ppk_derive_keys(unsigned int, const struct ppk_cipher *, ptrlen, strbuf *, ptrlen *, ptrlen *, ptrlen *, ptrlen, ppk_save_parameters *)"
                   );
    }
    if (ciphertype->keylen == 0) {
      empty.len = 0;
    }
    else {
      _passes = make_ptrlen(anon_var_dwarf_23ee3 + 10,0);
      empty.len = 0x20;
      ctr = (int)ciphertype->keylen + (int)ciphertype->ivlen + 0x20;
      if ((params->argon2_passes_auto & 1U) == 0) {
        argon2(params->argon2_flavour,params->argon2_mem,(params->field_4).argon2_passes,
               params->argon2_parallelism,ctr,passphrase,passphrase_salt,_passes,_passes,storage);
      }
      else {
        argon2_choose_passes
                  (params->argon2_flavour,params->argon2_mem,(params->field_4).argon2_passes,
                   &local_68.argon2_passes,params->argon2_parallelism,ctr,passphrase,passphrase_salt
                   ,_passes,_passes,storage);
        params->argon2_passes_auto = false;
        params->field_4 = local_68;
      }
    }
  }
  pVar4 = ptrlen_from_strbuf(storage);
  BinarySource_INIT__((BinarySource *)local_b8,pVar4);
  pVar4 = BinarySource_get_data((BinarySource *)src[0]._24_8_,ciphertype->keylen);
  local_d8 = pVar4.ptr;
  cipherkey->ptr = local_d8;
  local_d0 = pVar4.len;
  cipherkey->len = local_d0;
  pVar4 = BinarySource_get_data((BinarySource *)src[0]._24_8_,ciphertype->ivlen);
  local_e8 = pVar4.ptr;
  cipheriv->ptr = local_e8;
  local_e0 = pVar4.len;
  cipheriv->len = local_e0;
  pVar4 = BinarySource_get_data((BinarySource *)src[0]._24_8_,empty.len);
  local_f8 = pVar4.ptr;
  mackey->ptr = local_f8;
  local_f0 = pVar4.len;
  mackey->len = local_f0;
  return;
}

Assistant:

static void ssh2_ppk_derive_keys(
    unsigned fmt_version, const struct ppk_cipher *ciphertype,
    ptrlen passphrase, strbuf *storage, ptrlen *cipherkey, ptrlen *cipheriv,
    ptrlen *mackey, ptrlen passphrase_salt, ppk_save_parameters *params)
{
    size_t mac_keylen;

    switch (fmt_version) {
      case 3: {
        if (ciphertype->keylen == 0) {
            mac_keylen = 0;
            break;
        }
        ptrlen empty = PTRLEN_LITERAL("");

        mac_keylen = 32;

        uint32_t taglen = ciphertype->keylen + ciphertype->ivlen + mac_keylen;

        if (params->argon2_passes_auto) {
            uint32_t passes;

            argon2_choose_passes(
                params->argon2_flavour, params->argon2_mem,
                params->argon2_milliseconds, &passes,
                params->argon2_parallelism, taglen,
                passphrase, passphrase_salt, empty, empty, storage);

            params->argon2_passes_auto = false;
            params->argon2_passes = passes;
        } else {
            argon2(params->argon2_flavour, params->argon2_mem,
                   params->argon2_passes, params->argon2_parallelism, taglen,
                   passphrase, passphrase_salt, empty, empty, storage);
        }

        break;
      }

      case 2:
      case 1: {
        /* Counter-mode iteration to generate cipher key data. */
        for (unsigned ctr = 0; ctr * 20 < ciphertype->keylen; ctr++) {
            ssh_hash *h = ssh_hash_new(&ssh_sha1);
            put_uint32(h, ctr);
            put_datapl(h, passphrase);
            ssh_hash_final(h, strbuf_append(storage, 20));
        }
        strbuf_shrink_to(storage, ciphertype->keylen);

        /* In this version of the format, the CBC IV was always all 0. */
        put_padding(storage, ciphertype->ivlen, 0);

        /* Completely separate hash for the MAC key. */
        ssh_hash *h = ssh_hash_new(&ssh_sha1);
        mac_keylen = ssh_hash_alg(h)->hlen;
        put_datapl(h, PTRLEN_LITERAL("putty-private-key-file-mac-key"));
        put_datapl(h, passphrase);
        ssh_hash_final(h, strbuf_append(storage, mac_keylen));

        break;
      }

      default:
        unreachable("bad format version in ssh2_ppk_derive_keys");
    }

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(storage));
    *cipherkey = get_data(src, ciphertype->keylen);
    *cipheriv = get_data(src, ciphertype->ivlen);
    *mackey = get_data(src, mac_keylen);
}